

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_tri_collision.cpp
# Opt level: O2

bool __thiscall
GIM_TRIANGLE_CALCULATION_CACHE::triangle_collision
          (GIM_TRIANGLE_CALCULATION_CACHE *this,btVector3 *u0,btVector3 *u1,btVector3 *u2,
          btScalar margin_u,btVector3 *v0,btVector3 *v1,btVector3 *v2,btScalar margin_v,
          GIM_TRIANGLE_CONTACT_DATA *contacts)

{
  btVector3 *clip_points;
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined8 uVar29;
  float fVar30;
  float fVar31;
  float local_98;
  btScalar local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  fVar7 = margin_u + margin_v;
  this->margin = fVar7;
  uVar29 = *(undefined8 *)(u0->m_floats + 2);
  *(undefined8 *)this->tu_vertices[0].m_floats = *(undefined8 *)u0->m_floats;
  *(undefined8 *)(this->tu_vertices[0].m_floats + 2) = uVar29;
  uVar29 = *(undefined8 *)(u1->m_floats + 2);
  *(undefined8 *)this->tu_vertices[1].m_floats = *(undefined8 *)u1->m_floats;
  *(undefined8 *)(this->tu_vertices[1].m_floats + 2) = uVar29;
  uVar29 = *(undefined8 *)(u2->m_floats + 2);
  *(undefined8 *)this->tu_vertices[2].m_floats = *(undefined8 *)u2->m_floats;
  *(undefined8 *)(this->tu_vertices[2].m_floats + 2) = uVar29;
  uVar29 = *(undefined8 *)(v0->m_floats + 2);
  *(undefined8 *)this->tv_vertices[0].m_floats = *(undefined8 *)v0->m_floats;
  *(undefined8 *)(this->tv_vertices[0].m_floats + 2) = uVar29;
  uVar29 = *(undefined8 *)(v1->m_floats + 2);
  *(undefined8 *)this->tv_vertices[1].m_floats = *(undefined8 *)v1->m_floats;
  *(undefined8 *)(this->tv_vertices[1].m_floats + 2) = uVar29;
  uVar29 = *(undefined8 *)(v2->m_floats + 2);
  *(undefined8 *)this->tv_vertices[2].m_floats = *(undefined8 *)v2->m_floats;
  *(undefined8 *)(this->tv_vertices[2].m_floats + 2) = uVar29;
  uVar29 = *(undefined8 *)this->tv_vertices[1].m_floats;
  uVar18 = *(undefined8 *)this->tv_vertices[0].m_floats;
  fVar27 = (float)uVar18;
  local_98 = (float)((ulong)uVar18 >> 0x20);
  fVar6 = (float)uVar29;
  fVar9 = (float)((ulong)uVar29 >> 0x20);
  fVar13 = this->tv_vertices[1].m_floats[2];
  fVar12 = this->tv_vertices[0].m_floats[2];
  fVar10 = this->tv_vertices[2].m_floats[0];
  fVar11 = this->tv_vertices[2].m_floats[1];
  local_58 = ZEXT416((uint)fVar11);
  fVar1 = this->tv_vertices[2].m_floats[2];
  local_48 = ZEXT416((uint)fVar10);
  local_38 = ZEXT416((uint)fVar1);
  fVar15 = (fVar1 - fVar12) * (fVar9 - local_98) - (fVar11 - local_98) * (fVar13 - fVar12);
  fVar16 = (fVar13 - fVar12) * (fVar10 - fVar27) - (fVar1 - fVar12) * (fVar6 - fVar27);
  *(ulong *)(this->tv_plane).super_btVector3.m_floats = CONCAT44(fVar16,fVar15);
  fVar17 = (fVar11 - local_98) * (fVar6 - fVar27) - (fVar9 - local_98) * (fVar10 - fVar27);
  (this->tv_plane).super_btVector3.m_floats[2] = fVar17;
  fVar8 = fVar17 * fVar17 + fVar15 * fVar15 + fVar16 * fVar16;
  if (1e-07 < fVar8) {
    fVar5 = (float)(0x5f3759df - ((uint)fVar8 >> 1));
    fVar5 = (fVar8 * -0.5 * fVar5 * fVar5 + 1.5) * fVar5;
    if (fVar5 < 3.4028235e+38) {
      fVar17 = fVar17 * fVar5;
      fVar15 = fVar15 * fVar5;
      fVar16 = fVar16 * fVar5;
      *(ulong *)(this->tv_plane).super_btVector3.m_floats = CONCAT44(fVar16,fVar15);
      (this->tv_plane).super_btVector3.m_floats[2] = fVar17;
    }
  }
  fVar8 = this->tu_vertices[0].m_floats[2];
  uVar2 = *(undefined8 *)this->tu_vertices[0].m_floats;
  uVar3 = *(undefined8 *)this->tu_vertices[1].m_floats;
  fVar25 = (float)uVar3;
  fVar28 = (float)((ulong)uVar3 >> 0x20);
  fVar5 = this->tu_vertices[1].m_floats[2];
  fVar23 = (float)uVar2;
  fVar24 = (float)((ulong)uVar2 >> 0x20);
  local_68 = ZEXT416((uint)fVar8);
  local_78 = ZEXT416((uint)fVar5);
  fVar14 = this->tu_vertices[2].m_floats[0];
  fVar26 = this->tu_vertices[2].m_floats[1];
  fVar22 = this->tu_vertices[2].m_floats[2];
  fVar31 = fVar12 * fVar17 + fVar27 * fVar15 + local_98 * fVar16;
  (this->tv_plane).super_btVector3.m_floats[3] = fVar31;
  fVar19 = (fVar8 * fVar17 + fVar23 * fVar15 + fVar24 * fVar16) - fVar31;
  fVar20 = (fVar5 * fVar17 + fVar25 * fVar15 + fVar28 * fVar16) - fVar31;
  *(ulong *)this->du = CONCAT44(fVar20,fVar19);
  fVar21 = (fVar22 * fVar17 + fVar14 * fVar15 + fVar26 * fVar16) - fVar31;
  this->du[2] = fVar21;
  this->du0du1 = fVar20 * fVar19;
  this->du0du2 = fVar19 * fVar21;
  if ((fVar20 * fVar19 <= 0.0) || (fVar19 * fVar21 <= 0.0)) {
    if (0.0 <= (fVar19 + fVar20 + fVar21) / 3.0) {
      if (fVar20 <= fVar21) {
        fVar21 = fVar20;
      }
      if (fVar19 <= fVar21) {
        fVar21 = fVar19;
      }
      (this->distances).m_floats[0] = fVar21;
    }
    else {
      local_98 = local_98 + fVar9;
      fVar30 = (fVar27 + fVar6) - fVar6;
      fVar9 = local_98 - fVar9;
      *(ulong *)this->tv_vertices[1].m_floats = CONCAT44(fVar9,fVar30);
      local_98 = local_98 - fVar9;
      uVar18 = CONCAT44(local_98,(fVar27 + fVar6) - fVar30);
      *(undefined8 *)this->tv_vertices[0].m_floats = uVar18;
      fVar12 = fVar12 + fVar13;
      fVar13 = fVar12 - fVar13;
      this->tv_vertices[1].m_floats[2] = fVar13;
      fVar12 = fVar12 - fVar13;
      this->tv_vertices[0].m_floats[2] = fVar12;
      (this->tv_plane).super_btVector3.m_floats[0] = -fVar15;
      (this->tv_plane).super_btVector3.m_floats[1] = -fVar16;
      (this->tv_plane).super_btVector3.m_floats[2] = -fVar17;
      (this->tv_plane).super_btVector3.m_floats[3] = -fVar31;
      if (fVar21 <= fVar20) {
        fVar21 = fVar20;
      }
      if (fVar21 <= fVar19) {
        fVar21 = fVar19;
      }
      fVar21 = -fVar21;
      (this->distances).m_floats[0] = fVar21;
      uVar29 = CONCAT44(fVar9,fVar30);
    }
  }
  else if (0.0 <= fVar19) {
    if (fVar20 <= fVar21) {
      fVar21 = fVar20;
    }
    if (fVar19 <= fVar21) {
      fVar21 = fVar19;
    }
    (this->distances).m_floats[0] = fVar21;
    if (fVar7 < fVar21) {
      return false;
    }
  }
  else {
    if (fVar21 <= fVar20) {
      fVar21 = fVar20;
    }
    if (fVar21 <= fVar19) {
      fVar21 = fVar19;
    }
    fVar21 = -fVar21;
    (this->distances).m_floats[0] = fVar21;
    if (fVar7 < fVar21) {
      return false;
    }
    local_98 = local_98 + fVar9;
    fVar19 = (fVar27 + fVar6) - fVar6;
    fVar9 = local_98 - fVar9;
    *(ulong *)this->tv_vertices[1].m_floats = CONCAT44(fVar9,fVar19);
    local_98 = local_98 - fVar9;
    uVar18 = CONCAT44(local_98,(fVar27 + fVar6) - fVar19);
    *(undefined8 *)this->tv_vertices[0].m_floats = uVar18;
    fVar12 = fVar12 + fVar13;
    fVar13 = fVar12 - fVar13;
    this->tv_vertices[1].m_floats[2] = fVar13;
    fVar12 = fVar12 - fVar13;
    this->tv_vertices[0].m_floats[2] = fVar12;
    (this->tv_plane).super_btVector3.m_floats[0] = -fVar15;
    (this->tv_plane).super_btVector3.m_floats[1] = -fVar16;
    (this->tv_plane).super_btVector3.m_floats[2] = -fVar17;
    (this->tv_plane).super_btVector3.m_floats[3] = -fVar31;
    uVar29 = CONCAT44(fVar9,fVar19);
  }
  fVar22 = fVar22 - fVar8;
  fVar26 = fVar26 - fVar24;
  fVar14 = fVar14 - fVar23;
  fVar16 = (fVar28 - fVar24) * fVar22 - fVar26 * (fVar5 - fVar8);
  fVar17 = fVar14 * (fVar5 - fVar8) - fVar22 * (fVar25 - fVar23);
  *(ulong *)(this->tu_plane).super_btVector3.m_floats = CONCAT44(fVar17,fVar16);
  fVar27 = fVar26 * (fVar25 - fVar23) - (fVar28 - fVar24) * fVar14;
  (this->tu_plane).super_btVector3.m_floats[2] = fVar27;
  fVar15 = fVar27 * fVar27 + fVar16 * fVar16 + fVar17 * fVar17;
  if (1e-07 < fVar15) {
    fVar6 = (float)(0x5f3759df - ((uint)fVar15 >> 1));
    fVar6 = (fVar15 * -0.5 * fVar6 * fVar6 + 1.5) * fVar6;
    if (fVar6 < 3.4028235e+38) {
      fVar27 = fVar27 * fVar6;
      fVar16 = fVar16 * fVar6;
      fVar17 = fVar17 * fVar6;
      *(ulong *)(this->tu_plane).super_btVector3.m_floats = CONCAT44(fVar17,fVar16);
      (this->tu_plane).super_btVector3.m_floats[2] = fVar27;
    }
  }
  fVar15 = fVar8 * fVar27 + fVar23 * fVar16 + fVar24 * fVar17;
  (this->tu_plane).super_btVector3.m_floats[3] = fVar15;
  fVar12 = (fVar12 * fVar27 + (float)uVar18 * fVar16 + local_98 * fVar17) - fVar15;
  this->dv[0] = fVar12;
  fVar9 = (fVar13 * fVar27 + (float)uVar29 * fVar16 + fVar9 * fVar17) - fVar15;
  fVar13 = (fVar1 * fVar27 + fVar10 * fVar16 + fVar11 * fVar17) - fVar15;
  *(ulong *)(this->dv + 1) = CONCAT44(fVar13,fVar9);
  this->dv0dv1 = fVar12 * fVar9;
  this->dv0dv2 = fVar12 * fVar13;
  if ((fVar12 * fVar9 <= 0.0) || (fVar12 * fVar13 <= 0.0)) {
    if (0.0 <= (fVar13 + fVar12 + fVar9) / 3.0) {
      if (fVar9 <= fVar13) {
        fVar13 = fVar9;
      }
      if (fVar12 <= fVar13) {
        fVar13 = fVar12;
      }
    }
    else {
      fVar10 = (fVar23 + fVar25) - fVar25;
      fVar11 = (fVar24 + fVar28) - fVar28;
      *(ulong *)this->tu_vertices[1].m_floats = CONCAT44(fVar11,fVar10);
      *(ulong *)this->tu_vertices[0].m_floats =
           CONCAT44((fVar24 + fVar28) - fVar11,(fVar23 + fVar25) - fVar10);
      fVar10 = (fVar8 + fVar5) - fVar5;
      this->tu_vertices[1].m_floats[2] = fVar10;
      this->tu_vertices[0].m_floats[2] = (fVar8 + fVar5) - fVar10;
      (this->tu_plane).super_btVector3.m_floats[0] = -fVar16;
      (this->tu_plane).super_btVector3.m_floats[1] = -fVar17;
      (this->tu_plane).super_btVector3.m_floats[2] = -fVar27;
      (this->tu_plane).super_btVector3.m_floats[3] = -fVar15;
      if (fVar13 <= fVar9) {
        fVar13 = fVar9;
      }
      if (fVar13 <= fVar12) {
        fVar13 = fVar12;
      }
      fVar13 = -fVar13;
    }
    (this->distances).m_floats[1] = fVar13;
  }
  else if (0.0 <= fVar12) {
    if (fVar9 <= fVar13) {
      fVar13 = fVar9;
    }
    if (fVar12 <= fVar13) {
      fVar13 = fVar12;
    }
    (this->distances).m_floats[1] = fVar13;
    if (fVar7 < fVar13) {
      return false;
    }
  }
  else {
    if (fVar13 <= fVar9) {
      fVar13 = fVar9;
    }
    if (fVar13 <= fVar12) {
      fVar13 = fVar12;
    }
    fVar13 = -fVar13;
    (this->distances).m_floats[1] = fVar13;
    if (fVar7 < fVar13) {
      return false;
    }
    fVar12 = (fVar23 + fVar25) - fVar25;
    fVar10 = (fVar24 + fVar28) - fVar28;
    *(ulong *)this->tu_vertices[1].m_floats = CONCAT44(fVar10,fVar12);
    *(ulong *)this->tu_vertices[0].m_floats =
         CONCAT44((fVar24 + fVar28) - fVar10,(fVar23 + fVar25) - fVar12);
    fVar12 = (fVar8 + fVar5) - fVar5;
    this->tu_vertices[1].m_floats[2] = fVar12;
    this->tu_vertices[0].m_floats[2] = (fVar8 + fVar5) - fVar12;
    (this->tu_plane).super_btVector3.m_floats[0] = -fVar16;
    (this->tu_plane).super_btVector3.m_floats[1] = -fVar17;
    (this->tu_plane).super_btVector3.m_floats[2] = -fVar27;
    (this->tu_plane).super_btVector3.m_floats[3] = -fVar15;
  }
  clip_points = this->contact_points;
  if (fVar21 < fVar13) {
    uVar4 = clip_triangle(this,&this->tu_plane,this->tu_vertices,this->tv_vertices,clip_points);
    if (uVar4 != 0) {
      GIM_TRIANGLE_CONTACT_DATA::merge_points
                (contacts,&this->tu_plane,this->margin,clip_points,uVar4);
      local_7c = -1.0;
      btVector3::operator*=((btVector3 *)(contacts + 8),&local_7c);
      goto LAB_00160f2e;
    }
  }
  else {
    uVar4 = clip_triangle(this,&this->tv_plane,this->tv_vertices,this->tu_vertices,clip_points);
    if (uVar4 != 0) {
      GIM_TRIANGLE_CONTACT_DATA::merge_points
                (contacts,&this->tv_plane,this->margin,clip_points,uVar4);
LAB_00160f2e:
      return *(int *)(contacts + 4) != 0;
    }
  }
  return false;
}

Assistant:

SIMD_FORCE_INLINE bool triangle_collision(
					const btVector3 & u0,
					const btVector3 & u1,
					const btVector3 & u2,
					GREAL margin_u,
					const btVector3 & v0,
					const btVector3 & v1,
					const btVector3 & v2,
					GREAL margin_v,
					GIM_TRIANGLE_CONTACT_DATA & contacts)
	{

		margin = margin_u + margin_v;

		tu_vertices[0] = u0;
		tu_vertices[1] = u1;
		tu_vertices[2] = u2;

		tv_vertices[0] = v0;
		tv_vertices[1] = v1;
		tv_vertices[2] = v2;

		//create planes
		// plane v vs U points

		TRIANGLE_PLANE(tv_vertices[0],tv_vertices[1],tv_vertices[2],tv_plane);

		du[0] = DISTANCE_PLANE_POINT(tv_plane,tu_vertices[0]);
		du[1] = DISTANCE_PLANE_POINT(tv_plane,tu_vertices[1]);
		du[2] = DISTANCE_PLANE_POINT(tv_plane,tu_vertices[2]);


		du0du1 = du[0] * du[1];
		du0du2 = du[0] * du[2];


		if(du0du1>0.0f && du0du2>0.0f)	// same sign on all of them + not equal 0 ?
		{
			if(du[0]<0) //we need test behind the triangle plane
			{
				distances[0] = GIM_MAX3(du[0],du[1],du[2]);
				distances[0] = -distances[0];
				if(distances[0]>margin) return false; //never intersect

				//reorder triangle v
				VEC_SWAP(tv_vertices[0],tv_vertices[1]);
				VEC_SCALE_4(tv_plane,-1.0f,tv_plane);
			}
			else
			{
				distances[0] = GIM_MIN3(du[0],du[1],du[2]);
				if(distances[0]>margin) return false; //never intersect
			}
		}
		else
		{
			//Look if we need to invert the triangle
			distances[0] = (du[0]+du[1]+du[2])/3.0f; //centroid

			if(distances[0]<0.0f)
			{
				//reorder triangle v
				VEC_SWAP(tv_vertices[0],tv_vertices[1]);
				VEC_SCALE_4(tv_plane,-1.0f,tv_plane);

				distances[0] = GIM_MAX3(du[0],du[1],du[2]);
				distances[0] = -distances[0];
			}
			else
			{
				distances[0] = GIM_MIN3(du[0],du[1],du[2]);
			}
		}


		// plane U vs V points

		TRIANGLE_PLANE(tu_vertices[0],tu_vertices[1],tu_vertices[2],tu_plane);

		dv[0] = DISTANCE_PLANE_POINT(tu_plane,tv_vertices[0]);
		dv[1] = DISTANCE_PLANE_POINT(tu_plane,tv_vertices[1]);
		dv[2] = DISTANCE_PLANE_POINT(tu_plane,tv_vertices[2]);

		dv0dv1 = dv[0] * dv[1];
		dv0dv2 = dv[0] * dv[2];


		if(dv0dv1>0.0f && dv0dv2>0.0f)	// same sign on all of them + not equal 0 ?
		{
			if(dv[0]<0) //we need test behind the triangle plane
			{
				distances[1] = GIM_MAX3(dv[0],dv[1],dv[2]);
				distances[1] = -distances[1];
				if(distances[1]>margin) return false; //never intersect

				//reorder triangle u
				VEC_SWAP(tu_vertices[0],tu_vertices[1]);
				VEC_SCALE_4(tu_plane,-1.0f,tu_plane);
			}
			else
			{
				distances[1] = GIM_MIN3(dv[0],dv[1],dv[2]);
				if(distances[1]>margin) return false; //never intersect
			}
		}
		else
		{
			//Look if we need to invert the triangle
			distances[1] = (dv[0]+dv[1]+dv[2])/3.0f; //centroid

			if(distances[1]<0.0f)
			{
				//reorder triangle v
				VEC_SWAP(tu_vertices[0],tu_vertices[1]);
				VEC_SCALE_4(tu_plane,-1.0f,tu_plane);

				distances[1] = GIM_MAX3(dv[0],dv[1],dv[2]);
				distances[1] = -distances[1];
			}
			else
			{
				distances[1] = GIM_MIN3(dv[0],dv[1],dv[2]);
			}
		}

		GUINT bl;
		/* bl = cross_line_intersection_test();
		if(bl==3)
		{
			//take edge direction too
			bl = distances.maxAxis();
		}
		else
		{*/
			bl = 0;
			if(distances[0]<distances[1]) bl = 1;
		//}

		if(bl==2) //edge edge separation
		{
			if(distances[2]>margin) return false;

			contacts.m_penetration_depth = -distances[2] + margin;
			contacts.m_points[0] = closest_point_v;
			contacts.m_point_count = 1;
			VEC_COPY(contacts.m_separating_normal,edge_edge_dir);

			return true;
		}

		//clip face against other

		
		GUINT point_count;
		//TODO
		if(bl == 0) //clip U points against V
		{
			point_count = clip_triangle(tv_plane,tv_vertices,tu_vertices,contact_points);
			if(point_count == 0) return false;						
			contacts.merge_points(tv_plane,margin,contact_points,point_count);			
		}
		else //clip V points against U
		{
			point_count = clip_triangle(tu_plane,tu_vertices,tv_vertices,contact_points);
			if(point_count == 0) return false;			
			contacts.merge_points(tu_plane,margin,contact_points,point_count);
			contacts.m_separating_normal *= -1.f;
		}
		if(contacts.m_point_count == 0) return false;
		return true;
	}